

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Integrate.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Integrate::ArchiveIN(ChFunction_Integrate *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<int> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Integrate>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->fa;
  local_30._name = "fa";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->order;
  local_48._name = "order";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->C_start;
  local_60._name = "C_start";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->x_start;
  local_78._name = "x_start";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->x_end;
  local_90._name = "x_end";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->num_samples;
  local_a8._name = "num_samples";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,
             (long)this->num_samples);
  ComputeIntegral(this);
  return;
}

Assistant:

void ChFunction_Integrate::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Integrate>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(fa);
    marchive >> CHNVP(order);
    marchive >> CHNVP(C_start);
    marchive >> CHNVP(x_start);
    marchive >> CHNVP(x_end);
    marchive >> CHNVP(num_samples);
    array_x.setZero(num_samples);
    ComputeIntegral();
}